

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O1

void __thiscall miniros::PollSet::update(PollSet *this,int poll_timeout)

{
  _Rb_tree_header *p_Var1;
  _Manager_type *pp_Var2;
  short sVar3;
  socket_pollfd *fds;
  _Base_ptr p_Var4;
  int *piVar5;
  pointer piVar6;
  Level level;
  void *logger_handle;
  int iVar7;
  _Base_ptr p_Var8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  char *pcVar10;
  pointer ppVar11;
  uint uVar12;
  _Rb_tree_header *p_Var13;
  int fd;
  SocketUpdateFunc func;
  uint local_5c;
  TransportPtr transport;
  shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>_> ofds;
  
  createNativePollset(this);
  fds = (this->ufds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
        super__Vector_impl_data._M_start;
  poll_sockets((miniros *)&ofds,this->epfd_,fds,
               (long)(this->ufds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)fds >> 3,poll_timeout);
  if (ofds.
      super___shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (update::loc.initialized_ == false) {
      pp_Var2 = &func.super__Function_base._M_manager;
      func.super__Function_base._M_functor._M_unused._M_object = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&func,"miniros.poll_set","");
      console::initializeLogLocation(&update::loc,(string *)&func,Error);
      if ((_Manager_type *)func.super__Function_base._M_functor._M_unused._0_8_ != pp_Var2) {
        operator_delete(func.super__Function_base._M_functor._M_unused._M_object,
                        (ulong)(func.super__Function_base._M_manager + 1));
      }
    }
    if (update::loc.level_ != Error) {
      console::setLogLocationLevel(&update::loc,Error);
      console::checkLogLocationEnabled(&update::loc);
    }
    logger_handle = update::loc.logger_;
    level = update::loc.level_;
    if (update::loc.logger_enabled_ == true) {
      pcVar10 = last_socket_error_string();
      console::print((FilterBase *)0x0,logger_handle,level,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                     ,0xc3,"void miniros::PollSet::update(int)","poll failed with error %s",pcVar10)
      ;
    }
  }
  else {
    ppVar11 = ((ofds.
                super___shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super__Vector_base<pollfd,_std::allocator<pollfd>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppVar11 !=
        ((ofds.
          super___shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super__Vector_base<pollfd,_std::allocator<pollfd>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      p_Var1 = &(this->socket_info_)._M_t._M_impl.super__Rb_tree_header;
      do {
        fd = ppVar11->fd;
        sVar3 = ppVar11->revents;
        func.super__Function_base._M_manager = (_Manager_type)0x0;
        func._M_invoker = (_Invoker_type)0x0;
        func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
        func.super__Function_base._M_functor._8_8_ = 0;
        transport.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        transport.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (sVar3 != 0) {
          iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->socket_info_mutex_);
          if (iVar7 != 0) {
            std::__throw_system_error(iVar7);
          }
          p_Var4 = (this->socket_info_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var8 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
              p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < fd]) {
            if (fd <= (int)*(size_t *)(p_Var4 + 1)) {
              p_Var8 = p_Var4;
            }
          }
          p_Var13 = p_Var1;
          if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
             (p_Var13 = (_Rb_tree_header *)p_Var8,
             fd < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
            p_Var13 = p_Var1;
          }
          if (p_Var13 == p_Var1) {
            uVar12 = 0x38;
          }
          else {
            std::function<void_(int)>::operator=
                      (&func,(function<void_(int)> *)((long)(p_Var13 + 1) + 0x10));
            transport.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)(p_Var13 + 1);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&transport.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)(p_Var13 + 1) + 8));
            uVar12 = *(uint *)((long)(p_Var13 + 2) + 0xc) | 0x38;
          }
          pthread_mutex_unlock((pthread_mutex_t *)&this->socket_info_mutex_);
          if (((p_Var13 != p_Var1) && (func.super__Function_base._M_manager != (_Manager_type)0x0))
             && (uVar12 = uVar12 & (int)sVar3, uVar12 != 0)) {
            if (((int)sVar3 & 0x38U) != 0) {
              iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->just_deleted_mutex_);
              if (iVar7 != 0) {
                std::__throw_system_error(iVar7);
              }
              _Var9 = std::
                      __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                ((this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 (this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,&fd);
              piVar5 = (this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              pthread_mutex_unlock((pthread_mutex_t *)&this->just_deleted_mutex_);
              if (_Var9._M_current != piVar5) goto LAB_001f08df;
            }
            local_5c = uVar12;
            if (func.super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*func._M_invoker)((_Any_data *)&func,(int *)&local_5c);
          }
        }
LAB_001f08df:
        if (transport.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (transport.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (func.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*func.super__Function_base._M_manager)
                    ((_Any_data *)&func,(_Any_data *)&func,__destroy_functor);
        }
        ppVar11 = ppVar11 + 1;
      } while (ppVar11 !=
               ((ofds.
                 super___shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<pollfd,_std::allocator<pollfd>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->just_deleted_mutex_);
  if (iVar7 == 0) {
    piVar6 = (this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar6) {
      (this->just_deleted_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar6;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->just_deleted_mutex_);
    if (ofds.
        super___shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (ofds.
                 super___shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return;
  }
  std::__throw_system_error(iVar7);
}

Assistant:

void PollSet::update(int poll_timeout)
{
  createNativePollset();

  // Poll across the sockets we're servicing
  std::shared_ptr<std::vector<socket_pollfd> > ofds = poll_sockets(epfd_, &ufds_.front(), ufds_.size(), poll_timeout);
  if (!ofds)
  {
    MINIROS_ERROR("poll failed with error %s", last_socket_error_string());
  }
  else
  {
    for (std::vector<socket_pollfd>::iterator it = ofds->begin() ; it != ofds->end(); ++it)
    {
      int fd = it->fd;
      int revents = it->revents;
      SocketUpdateFunc func;
      TransportPtr transport;
      int events = 0;

      if (revents == 0)
      {
        continue;
      }
      {
        std::scoped_lock<std::mutex> lock(socket_info_mutex_);
        M_SocketInfo::iterator it = socket_info_.find(fd);
        // the socket has been entirely deleted
        if (it == socket_info_.end())
        {
          continue;
        }

        const SocketInfo& info = it->second;

        // Store off the function and transport in case the socket is deleted from another thread
        func = info.func_;
        transport = info.transport_;
        events = info.events_;
      }

      // If these are registered events for this socket, OR the events are ERR/HUP/NVAL,
      // call through to the registered function
      if (func
          && ((events & revents)
              || (revents & POLLERR)
              || (revents & POLLHUP)
              || (revents & POLLNVAL)))
      {
        bool skip = false;
        if (revents & (POLLNVAL|POLLERR|POLLHUP))
        {
          // If a socket was just closed and then the file descriptor immediately reused, we can
          // get in here with what we think is a valid socket (since it was just re-added to our set)
          // but which is actually referring to the previous fd with the same #.  If this is the case,
          // we ignore the first instance of one of these errors.  If it's a real error we'll
          // hit it again next time through.
          std::scoped_lock<std::mutex> lock(just_deleted_mutex_);
          if (std::find(just_deleted_.begin(), just_deleted_.end(), fd) != just_deleted_.end())
          {
            skip = true;
          }
        }

        if (!skip)
        {
          func(revents & (events|POLLERR|POLLHUP|POLLNVAL));
        }
      }
    }
  }

  std::scoped_lock<std::mutex> lock(just_deleted_mutex_);
  just_deleted_.clear();

}